

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O0

vector<basist::ktx2_transcoder::key_value> * __thiscall
basisu::vector<basist::ktx2_transcoder::key_value>::operator=
          (vector<basist::ktx2_transcoder::key_value> *this,
          vector<basist::ktx2_transcoder::key_value> *other)

{
  uint32_t uVar1;
  key_value *in_RSI;
  key_value *in_RDI;
  uint32_t i;
  key_value *pSrc;
  key_value *pDst;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  size_t in_stack_ffffffffffffffd8;
  vector<basist::ktx2_transcoder::key_value> *in_stack_ffffffffffffffe0;
  key_value *local_8;
  
  local_8 = in_RDI;
  if (in_RDI != in_RSI) {
    if ((in_RDI->m_key).m_capacity < (in_RSI->m_key).m_size) {
      clear((vector<basist::ktx2_transcoder::key_value> *)
            CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      increase_capacity((vector<basist::ktx2_transcoder::key_value> *)
                        CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        (uint32_t)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0),
                        SUB81((ulong)in_RDI >> 0x10,0));
    }
    else {
      resize(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
             SUB41((uint)in_stack_ffffffffffffffd4 >> 0x18,0));
    }
    for (uVar1 = (in_RSI->m_key).m_size; uVar1 != 0; uVar1 = uVar1 - 1) {
      construct<basist::ktx2_transcoder::key_value,basist::ktx2_transcoder::key_value>
                ((key_value *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),in_RDI);
    }
    (in_RDI->m_key).m_size = (in_RSI->m_key).m_size;
    local_8 = in_RDI;
  }
  return (vector<basist::ktx2_transcoder::key_value> *)local_8;
}

Assistant:

inline vector& operator= (const vector& other)
      {
         if (this == &other)
            return *this;

         if (m_capacity >= other.m_size)
            resize(0);
         else
         {
            clear();
            increase_capacity(other.m_size, false);
         }

         if (BASISU_IS_BITWISE_COPYABLE(T))
         {
             if ((m_p) && (other.m_p))
                memcpy(m_p, other.m_p, other.m_size * sizeof(T));
         }
         else
         {
            T* pDst = m_p;
            const T* pSrc = other.m_p;
            for (uint32_t i = other.m_size; i > 0; i--)
               construct(pDst++, *pSrc++);
         }

         m_size = other.m_size;

         return *this;
      }